

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode Curl_ossl_certchain(Curl_easy *data,SSL *ssl)

{
  ASN1_INTEGER *pAVar1;
  int certnum;
  SSL *data_00;
  OPENSSL_STACK *pOVar2;
  BIO_METHOD *type;
  X509_NAME *pXVar3;
  undefined8 uVar4;
  stack_st_X509_EXTENSION *exts;
  ASN1_TIME *pAVar5;
  size_t sVar6;
  uint local_18c;
  long info_len_10;
  long info_len_9;
  BIGNUM *pub_key_1;
  BIGNUM *g_1;
  BIGNUM *q_1;
  BIGNUM *p_1;
  BIGNUM *pub_key;
  BIGNUM *g;
  BIGNUM *q;
  BIGNUM *p;
  long info_len_8;
  BIGNUM *e;
  BIGNUM *n;
  size_t sStack_d0;
  int pktype;
  long info_len_7;
  long info_len_6;
  long info_len_5;
  long info_len_4;
  ASN1_OBJECT *sigalgoid;
  ASN1_OBJECT *pubkeyoid;
  X509_PUBKEY *xpubkey;
  X509_ALGOR *sigalg;
  long info_len_3;
  long info_len_2;
  long info_len_1;
  long info_len;
  ASN1_BIT_STRING *psig;
  char *ptr;
  EVP_PKEY *pEStack_58;
  int j;
  EVP_PKEY *pubkey;
  X509 *x;
  ASN1_INTEGER *num;
  BIO *mem;
  numcert_t numcerts;
  int i;
  stack_st_X509 *sk;
  SSL *pSStack_20;
  CURLcode result;
  SSL *ssl_local;
  Curl_easy *data_local;
  
  pSStack_20 = ssl;
  ssl_local = (SSL *)data;
  _numcerts = (stack_st_X509 *)SSL_get_peer_cert_chain((SSL *)ssl);
  if (_numcerts == (stack_st_X509 *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    pOVar2 = ossl_check_const_X509_sk_type(_numcerts);
    mem._0_4_ = OPENSSL_sk_num(pOVar2);
    sk._4_4_ = Curl_ssl_init_certinfo((Curl_easy *)ssl_local,(int)mem);
    data_local._4_4_ = sk._4_4_;
    if (sk._4_4_ == CURLE_OK) {
      type = BIO_s_mem();
      num = (ASN1_INTEGER *)BIO_new(type);
      if ((BIO *)num == (BIO *)0x0) {
        data_local._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        for (mem._4_4_ = 0; mem._4_4_ < (int)mem; mem._4_4_ = mem._4_4_ + 1) {
          pOVar2 = ossl_check_const_X509_sk_type(_numcerts);
          pubkey = (EVP_PKEY *)OPENSSL_sk_value(pOVar2,mem._4_4_);
          pAVar1 = num;
          pEStack_58 = (EVP_PKEY *)0x0;
          info_len = 0;
          pXVar3 = X509_get_subject_name((X509 *)pubkey);
          X509_NAME_print_ex((BIO *)pAVar1,pXVar3,0,0x82031f);
          info_len_1 = BIO_ctrl((BIO *)num,3,0,&psig);
          Curl_ssl_push_certinfo_len
                    ((Curl_easy *)ssl_local,mem._4_4_,"Subject",(char *)psig,info_len_1);
          BIO_ctrl((BIO *)num,1,0,(void *)0x0);
          pAVar1 = num;
          pXVar3 = X509_get_issuer_name((X509 *)pubkey);
          X509_NAME_print_ex((BIO *)pAVar1,pXVar3,0,0x82031f);
          info_len_2 = BIO_ctrl((BIO *)num,3,0,&psig);
          Curl_ssl_push_certinfo_len
                    ((Curl_easy *)ssl_local,mem._4_4_,"Issuer",(char *)psig,info_len_2);
          BIO_ctrl((BIO *)num,1,0,(void *)0x0);
          pAVar1 = num;
          uVar4 = X509_get_version(pubkey);
          BIO_printf((BIO *)pAVar1,"%lx",uVar4);
          info_len_3 = BIO_ctrl((BIO *)num,3,0,&psig);
          Curl_ssl_push_certinfo_len
                    ((Curl_easy *)ssl_local,mem._4_4_,"Version",(char *)psig,info_len_3);
          BIO_ctrl((BIO *)num,1,0,(void *)0x0);
          x = (X509 *)X509_get_serialNumber((X509 *)pubkey);
          if (((ASN1_INTEGER *)x)->type == 0x102) {
            BIO_puts((BIO *)num,"-");
          }
          for (ptr._4_4_ = 0; ptr._4_4_ < *(int *)x; ptr._4_4_ = ptr._4_4_ + 1) {
            BIO_printf((BIO *)num,"%02x",(ulong)*(byte *)(*(long *)(x + 8) + (long)ptr._4_4_));
          }
          sigalg = (X509_ALGOR *)BIO_ctrl((BIO *)num,3,0,&psig);
          Curl_ssl_push_certinfo_len
                    ((Curl_easy *)ssl_local,mem._4_4_,"Serial Number",(char *)psig,(size_t)sigalg);
          BIO_ctrl((BIO *)num,1,0,(void *)0x0);
          xpubkey = (X509_PUBKEY *)0x0;
          pubkeyoid = (ASN1_OBJECT *)0x0;
          sigalgoid = (ASN1_OBJECT *)0x0;
          X509_get0_signature(&info_len,&xpubkey,pubkey);
          if (xpubkey != (X509_PUBKEY *)0x0) {
            info_len_4 = 0;
            X509_ALGOR_get0((ASN1_OBJECT **)&info_len_4,(int *)0x0,(void **)0x0,
                            (X509_ALGOR *)xpubkey);
            i2a_ASN1_OBJECT((BIO *)num,(ASN1_OBJECT *)info_len_4);
            info_len_5 = BIO_ctrl((BIO *)num,3,0,&psig);
            Curl_ssl_push_certinfo_len
                      ((Curl_easy *)ssl_local,mem._4_4_,"Signature Algorithm",(char *)psig,
                       info_len_5);
            BIO_ctrl((BIO *)num,1,0,(void *)0x0);
          }
          pubkeyoid = (ASN1_OBJECT *)X509_get_X509_PUBKEY(pubkey);
          if (((X509_PUBKEY *)pubkeyoid != (X509_PUBKEY *)0x0) &&
             (X509_PUBKEY_get0_param
                        ((ASN1_OBJECT **)&sigalgoid,(uchar **)0x0,(int *)0x0,(X509_ALGOR **)0x0,
                         (X509_PUBKEY *)pubkeyoid), sigalgoid != (ASN1_OBJECT *)0x0)) {
            i2a_ASN1_OBJECT((BIO *)num,(ASN1_OBJECT *)sigalgoid);
            info_len_6 = BIO_ctrl((BIO *)num,3,0,&psig);
            Curl_ssl_push_certinfo_len
                      ((Curl_easy *)ssl_local,mem._4_4_,"Public Key Algorithm",(char *)psig,
                       info_len_6);
            BIO_ctrl((BIO *)num,1,0,(void *)0x0);
          }
          data_00 = ssl_local;
          certnum = mem._4_4_;
          exts = (stack_st_X509_EXTENSION *)X509_get0_extensions(pubkey);
          X509V3_ext((Curl_easy *)data_00,certnum,exts);
          pAVar1 = num;
          pAVar5 = (ASN1_TIME *)X509_get0_notBefore(pubkey);
          ASN1_TIME_print((BIO *)pAVar1,pAVar5);
          info_len_7 = BIO_ctrl((BIO *)num,3,0,&psig);
          Curl_ssl_push_certinfo_len
                    ((Curl_easy *)ssl_local,mem._4_4_,"Start date",(char *)psig,info_len_7);
          BIO_ctrl((BIO *)num,1,0,(void *)0x0);
          pAVar1 = num;
          pAVar5 = (ASN1_TIME *)X509_get0_notAfter(pubkey);
          ASN1_TIME_print((BIO *)pAVar1,pAVar5);
          sStack_d0 = BIO_ctrl((BIO *)num,3,0,&psig);
          Curl_ssl_push_certinfo_len
                    ((Curl_easy *)ssl_local,mem._4_4_,"Expire date",(char *)psig,sStack_d0);
          BIO_ctrl((BIO *)num,1,0,(void *)0x0);
          pEStack_58 = X509_get_pubkey((X509 *)pubkey);
          if (pEStack_58 == (EVP_PKEY *)0x0) {
            if ((ssl_local != (SSL *)0x0) && ((*(ulong *)(ssl_local + 0xa52) >> 0x1c & 1) != 0)) {
              Curl_infof((Curl_easy *)ssl_local,"   Unable to load public key");
            }
          }
          else {
            n._4_4_ = EVP_PKEY_get_id(pEStack_58);
            if (n._4_4_ == 6) {
              e = (BIGNUM *)0x0;
              info_len_8 = 0;
              EVP_PKEY_get_bn_param(pEStack_58,"n",&e);
              EVP_PKEY_get_bn_param(pEStack_58,"e",&info_len_8);
              pAVar1 = num;
              if (e == (BIGNUM *)0x0) {
                local_18c = 0;
              }
              else {
                local_18c = BN_num_bits((BIGNUM *)e);
              }
              BIO_printf((BIO *)pAVar1,"%d",(ulong)local_18c);
              p = (BIGNUM *)BIO_ctrl((BIO *)num,3,0,&psig);
              Curl_ssl_push_certinfo_len
                        ((Curl_easy *)ssl_local,mem._4_4_,"RSA Public Key",(char *)psig,(size_t)p);
              BIO_ctrl((BIO *)num,1,0,(void *)0x0);
              pubkey_show((Curl_easy *)ssl_local,(BIO *)num,mem._4_4_,"rsa","n",e);
              pubkey_show((Curl_easy *)ssl_local,(BIO *)num,mem._4_4_,"rsa","e",(BIGNUM *)info_len_8
                         );
              BN_clear_free((BIGNUM *)e);
              BN_clear_free((BIGNUM *)info_len_8);
            }
            else if (n._4_4_ == 0x1c) {
              q_1 = (BIGNUM *)0x0;
              g_1 = (BIGNUM *)0x0;
              pub_key_1 = (BIGNUM *)0x0;
              info_len_9 = 0;
              EVP_PKEY_get_bn_param(pEStack_58,"p",&q_1);
              EVP_PKEY_get_bn_param(pEStack_58,"q",&g_1);
              EVP_PKEY_get_bn_param(pEStack_58,"g",&pub_key_1);
              EVP_PKEY_get_bn_param(pEStack_58,"pub",&info_len_9);
              pubkey_show((Curl_easy *)ssl_local,(BIO *)num,mem._4_4_,"dh","p",q_1);
              pubkey_show((Curl_easy *)ssl_local,(BIO *)num,mem._4_4_,"dh","q",g_1);
              pubkey_show((Curl_easy *)ssl_local,(BIO *)num,mem._4_4_,"dh","g",pub_key_1);
              pubkey_show((Curl_easy *)ssl_local,(BIO *)num,mem._4_4_,"dh","pub_key",
                          (BIGNUM *)info_len_9);
              BN_clear_free((BIGNUM *)q_1);
              BN_clear_free((BIGNUM *)g_1);
              BN_clear_free((BIGNUM *)pub_key_1);
              BN_clear_free((BIGNUM *)info_len_9);
            }
            else if (n._4_4_ == 0x74) {
              q = (BIGNUM *)0x0;
              g = (BIGNUM *)0x0;
              pub_key = (BIGNUM *)0x0;
              p_1 = (BIGNUM *)0x0;
              EVP_PKEY_get_bn_param(pEStack_58,"p",&q);
              EVP_PKEY_get_bn_param(pEStack_58,"q",&g);
              EVP_PKEY_get_bn_param(pEStack_58,"g",&pub_key);
              EVP_PKEY_get_bn_param(pEStack_58,"pub",&p_1);
              pubkey_show((Curl_easy *)ssl_local,(BIO *)num,mem._4_4_,"dsa","p",q);
              pubkey_show((Curl_easy *)ssl_local,(BIO *)num,mem._4_4_,"dsa","q",g);
              pubkey_show((Curl_easy *)ssl_local,(BIO *)num,mem._4_4_,"dsa","g",pub_key);
              pubkey_show((Curl_easy *)ssl_local,(BIO *)num,mem._4_4_,"dsa","pub_key",p_1);
              BN_clear_free((BIGNUM *)q);
              BN_clear_free((BIGNUM *)g);
              BN_clear_free((BIGNUM *)pub_key);
              BN_clear_free((BIGNUM *)p_1);
            }
            EVP_PKEY_free(pEStack_58);
          }
          if (info_len != 0) {
            for (ptr._4_4_ = 0; ptr._4_4_ < *(int *)info_len; ptr._4_4_ = ptr._4_4_ + 1) {
              BIO_printf((BIO *)num,"%02x:",
                         (ulong)*(byte *)(*(long *)(info_len + 8) + (long)ptr._4_4_));
            }
            sVar6 = BIO_ctrl((BIO *)num,3,0,&psig);
            Curl_ssl_push_certinfo_len
                      ((Curl_easy *)ssl_local,mem._4_4_,"Signature",(char *)psig,sVar6);
            BIO_ctrl((BIO *)num,1,0,(void *)0x0);
          }
          PEM_write_bio_X509((BIO *)num,(X509 *)pubkey);
          sVar6 = BIO_ctrl((BIO *)num,3,0,&psig);
          Curl_ssl_push_certinfo_len((Curl_easy *)ssl_local,mem._4_4_,"Cert",(char *)psig,sVar6);
          BIO_ctrl((BIO *)num,1,0,(void *)0x0);
        }
        BIO_free((BIO *)num);
        data_local._4_4_ = CURLE_OK;
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_ossl_certchain(struct Curl_easy *data, SSL *ssl)
{
  CURLcode result;
  STACK_OF(X509) *sk;
  int i;
  numcert_t numcerts;
  BIO *mem;

  DEBUGASSERT(ssl);

  sk = SSL_get_peer_cert_chain(ssl);
  if(!sk) {
    return CURLE_OUT_OF_MEMORY;
  }

  numcerts = sk_X509_num(sk);

  result = Curl_ssl_init_certinfo(data, (int)numcerts);
  if(result) {
    return result;
  }

  mem = BIO_new(BIO_s_mem());
  if(!mem) {
    return CURLE_OUT_OF_MEMORY;
  }

  for(i = 0; i < (int)numcerts; i++) {
    ASN1_INTEGER *num;
    X509 *x = sk_X509_value(sk, i);
    EVP_PKEY *pubkey = NULL;
    int j;
    char *ptr;
    const ASN1_BIT_STRING *psig = NULL;

    X509_NAME_print_ex(mem, X509_get_subject_name(x), 0, XN_FLAG_ONELINE);
    push_certinfo("Subject", i);

    X509_NAME_print_ex(mem, X509_get_issuer_name(x), 0, XN_FLAG_ONELINE);
    push_certinfo("Issuer", i);

    BIO_printf(mem, "%lx", X509_get_version(x));
    push_certinfo("Version", i);

    num = X509_get_serialNumber(x);
    if(num->type == V_ASN1_NEG_INTEGER)
      BIO_puts(mem, "-");
    for(j = 0; j < num->length; j++)
      BIO_printf(mem, "%02x", num->data[j]);
    push_certinfo("Serial Number", i);

#if defined(HAVE_X509_GET0_SIGNATURE) && defined(HAVE_X509_GET0_EXTENSIONS)
    {
      const X509_ALGOR *sigalg = NULL;
      X509_PUBKEY *xpubkey = NULL;
      ASN1_OBJECT *pubkeyoid = NULL;

      X509_get0_signature(&psig, &sigalg, x);
      if(sigalg) {
        const ASN1_OBJECT *sigalgoid = NULL;
        X509_ALGOR_get0(&sigalgoid, NULL, NULL, sigalg);
        i2a_ASN1_OBJECT(mem, sigalgoid);
        push_certinfo("Signature Algorithm", i);
      }

      xpubkey = X509_get_X509_PUBKEY(x);
      if(xpubkey) {
        X509_PUBKEY_get0_param(&pubkeyoid, NULL, NULL, NULL, xpubkey);
        if(pubkeyoid) {
          i2a_ASN1_OBJECT(mem, pubkeyoid);
          push_certinfo("Public Key Algorithm", i);
        }
      }

      X509V3_ext(data, i, X509_get0_extensions(x));
    }
#else
    {
      /* before OpenSSL 1.0.2 */
      X509_CINF *cinf = x->cert_info;

      i2a_ASN1_OBJECT(mem, cinf->signature->algorithm);
      push_certinfo("Signature Algorithm", i);

      i2a_ASN1_OBJECT(mem, cinf->key->algor->algorithm);
      push_certinfo("Public Key Algorithm", i);

      X509V3_ext(data, i, cinf->extensions);

      psig = x->signature;
    }
#endif

    ASN1_TIME_print(mem, X509_get0_notBefore(x));
    push_certinfo("Start date", i);

    ASN1_TIME_print(mem, X509_get0_notAfter(x));
    push_certinfo("Expire date", i);

    pubkey = X509_get_pubkey(x);
    if(!pubkey)
      infof(data, "   Unable to load public key");
    else {
      int pktype;
#ifdef HAVE_OPAQUE_EVP_PKEY
      pktype = EVP_PKEY_id(pubkey);
#else
      pktype = pubkey->type;
#endif
      switch(pktype) {
      case EVP_PKEY_RSA:
      {
#ifndef HAVE_EVP_PKEY_GET_PARAMS
        RSA *rsa;
#ifdef HAVE_OPAQUE_EVP_PKEY
        rsa = EVP_PKEY_get0_RSA(pubkey);
#else
        rsa = pubkey->pkey.rsa;
#endif /* HAVE_OPAQUE_EVP_PKEY */
#endif /* !HAVE_EVP_PKEY_GET_PARAMS */

        {
#ifdef HAVE_OPAQUE_RSA_DSA_DH
          DECLARE_PKEY_PARAM_BIGNUM(n);
          DECLARE_PKEY_PARAM_BIGNUM(e);
#ifdef HAVE_EVP_PKEY_GET_PARAMS
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_RSA_N, &n);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_RSA_E, &e);
#else
          RSA_get0_key(rsa, &n, &e, NULL);
#endif /* HAVE_EVP_PKEY_GET_PARAMS */
          BIO_printf(mem, "%d", n ? BN_num_bits(n) : 0);
#else
          BIO_printf(mem, "%d", rsa->n ? BN_num_bits(rsa->n) : 0);
#endif /* HAVE_OPAQUE_RSA_DSA_DH */
          push_certinfo("RSA Public Key", i);
          print_pubkey_BN(rsa, n, i);
          print_pubkey_BN(rsa, e, i);
          FREE_PKEY_PARAM_BIGNUM(n);
          FREE_PKEY_PARAM_BIGNUM(e);
        }

        break;
      }
      case EVP_PKEY_DSA:
      {
#ifndef OPENSSL_NO_DSA
#ifndef HAVE_EVP_PKEY_GET_PARAMS
        DSA *dsa;
#ifdef HAVE_OPAQUE_EVP_PKEY
        dsa = EVP_PKEY_get0_DSA(pubkey);
#else
        dsa = pubkey->pkey.dsa;
#endif /* HAVE_OPAQUE_EVP_PKEY */
#endif /* !HAVE_EVP_PKEY_GET_PARAMS */
        {
#ifdef HAVE_OPAQUE_RSA_DSA_DH
          DECLARE_PKEY_PARAM_BIGNUM(p);
          DECLARE_PKEY_PARAM_BIGNUM(q);
          DECLARE_PKEY_PARAM_BIGNUM(g);
          DECLARE_PKEY_PARAM_BIGNUM(pub_key);
#ifdef HAVE_EVP_PKEY_GET_PARAMS
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_P, &p);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_Q, &q);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_G, &g);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_PUB_KEY, &pub_key);
#else
          DSA_get0_pqg(dsa, &p, &q, &g);
          DSA_get0_key(dsa, &pub_key, NULL);
#endif /* HAVE_EVP_PKEY_GET_PARAMS */
#endif /* HAVE_OPAQUE_RSA_DSA_DH */
          print_pubkey_BN(dsa, p, i);
          print_pubkey_BN(dsa, q, i);
          print_pubkey_BN(dsa, g, i);
          print_pubkey_BN(dsa, pub_key, i);
          FREE_PKEY_PARAM_BIGNUM(p);
          FREE_PKEY_PARAM_BIGNUM(q);
          FREE_PKEY_PARAM_BIGNUM(g);
          FREE_PKEY_PARAM_BIGNUM(pub_key);
        }
#endif /* !OPENSSL_NO_DSA */
        break;
      }
      case EVP_PKEY_DH:
      {
#ifndef HAVE_EVP_PKEY_GET_PARAMS
        DH *dh;
#ifdef HAVE_OPAQUE_EVP_PKEY
        dh = EVP_PKEY_get0_DH(pubkey);
#else
        dh = pubkey->pkey.dh;
#endif /* HAVE_OPAQUE_EVP_PKEY */
#endif /* !HAVE_EVP_PKEY_GET_PARAMS */
        {
#ifdef HAVE_OPAQUE_RSA_DSA_DH
          DECLARE_PKEY_PARAM_BIGNUM(p);
          DECLARE_PKEY_PARAM_BIGNUM(q);
          DECLARE_PKEY_PARAM_BIGNUM(g);
          DECLARE_PKEY_PARAM_BIGNUM(pub_key);
#ifdef HAVE_EVP_PKEY_GET_PARAMS
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_P, &p);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_Q, &q);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_G, &g);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_PUB_KEY, &pub_key);
#else
          DH_get0_pqg(dh, &p, &q, &g);
          DH_get0_key(dh, &pub_key, NULL);
#endif /* HAVE_EVP_PKEY_GET_PARAMS */
          print_pubkey_BN(dh, p, i);
          print_pubkey_BN(dh, q, i);
          print_pubkey_BN(dh, g, i);
#else
          print_pubkey_BN(dh, p, i);
          print_pubkey_BN(dh, g, i);
#endif /* HAVE_OPAQUE_RSA_DSA_DH */
          print_pubkey_BN(dh, pub_key, i);
          FREE_PKEY_PARAM_BIGNUM(p);
          FREE_PKEY_PARAM_BIGNUM(q);
          FREE_PKEY_PARAM_BIGNUM(g);
          FREE_PKEY_PARAM_BIGNUM(pub_key);
        }
        break;
      }
      }
      EVP_PKEY_free(pubkey);
    }

    if(psig) {
      for(j = 0; j < psig->length; j++)
        BIO_printf(mem, "%02x:", psig->data[j]);
      push_certinfo("Signature", i);
    }

    PEM_write_bio_X509(mem, x);
    push_certinfo("Cert", i);
  }

  BIO_free(mem);

  return CURLE_OK;
}